

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

Error __thiscall
asmjit::StringBuilder::_opString(StringBuilder *this,uint32_t op,char *str,size_t len)

{
  char *__dest;
  
  if (len == 0xffffffffffffffff) {
    if (str == (char *)0x0) {
      len = 0;
    }
    else {
      len = strlen(str);
    }
  }
  __dest = prepare(this,op,len);
  if (__dest != (char *)0x0) {
    memcpy(__dest,str,len);
  }
  return (uint)(__dest == (char *)0x0);
}

Assistant:

Error StringBuilder::_opString(uint32_t op, const char* str, size_t len) noexcept {
  if (len == Globals::kInvalidIndex)
    len = str ? ::strlen(str) : static_cast<size_t>(0);

  char* p = prepare(op, len);
  if (!p) return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(p, str, len);
  return kErrorOk;
}